

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

bool __thiscall gjkepa2_impl::GJK::EncloseOrigin(GJK *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  sSimplex *psVar4;
  sSV *psVar5;
  sSV *psVar6;
  sSV *psVar7;
  sSV *psVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  cbtVector3 cVar15;
  bool bVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  U i;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  cbtVector3 n;
  cbtVector3 p;
  cbtVector3 local_98;
  cbtVector3 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  cbtVector3 local_30;
  
  psVar4 = this->m_simplex;
  switch(psVar4->rank) {
  case 1:
    lVar20 = 0;
    uVar17 = (ulong)(this->m_nfree - 1);
    do {
      local_98.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_98.m_floats[lVar20] = 1.0;
      psVar4 = this->m_simplex;
      uVar18 = psVar4->rank;
      psVar4->p[uVar18] = 0.0;
      this->m_nfree = (U)uVar17;
      psVar5 = this->m_free[uVar17];
      psVar4->c[uVar18] = psVar5;
      psVar4->rank = uVar18 + 1;
      getsupport(this,&local_98,psVar5);
      bVar16 = EncloseOrigin(this);
      if (bVar16) {
        return true;
      }
      psVar4 = this->m_simplex;
      uVar18 = psVar4->rank - 1;
      psVar4->rank = uVar18;
      psVar5 = psVar4->c[uVar18];
      uVar18 = this->m_nfree;
      this->m_free[uVar18] = psVar5;
      psVar4 = this->m_simplex;
      auVar22._0_8_ = local_98.m_floats._0_8_ ^ 0x8000000080000000;
      auVar22._8_4_ = 0x80000000;
      auVar22._12_4_ = 0x80000000;
      auVar26._0_4_ = -local_98.m_floats[2];
      auVar26._4_4_ = 0x80000000;
      auVar26._8_4_ = 0x80000000;
      auVar26._12_4_ = 0x80000000;
      local_88.m_floats = (cbtScalar  [4])vinsertps_avx(auVar22,auVar26,0x28);
      uVar19 = psVar4->rank;
      psVar4->p[uVar19] = 0.0;
      this->m_nfree = uVar18;
      psVar4->c[uVar19] = psVar5;
      psVar4->rank = uVar19 + 1;
      getsupport(this,&local_88,psVar5);
      bVar16 = EncloseOrigin(this);
      if (bVar16) {
        return true;
      }
      psVar4 = this->m_simplex;
      lVar20 = lVar20 + 1;
      uVar18 = psVar4->rank - 1;
      psVar4->rank = uVar18;
      psVar5 = psVar4->c[uVar18];
      uVar17 = (ulong)this->m_nfree;
      this->m_nfree = this->m_nfree + 1;
      this->m_free[uVar17] = psVar5;
    } while (lVar20 != 3);
    break;
  case 2:
    auVar34 = ZEXT1664(_DAT_009d86b0);
    lVar20 = 0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)((psVar4->c[0]->w).m_floats + 1);
    fVar1 = (psVar4->c[1]->w).m_floats[0] - (psVar4->c[0]->w).m_floats[0];
    auVar32 = ZEXT464((uint)fVar1);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)((psVar4->c[1]->w).m_floats + 1);
    local_58 = vsubps_avx(auVar23,auVar28);
    auVar33 = ZEXT1664(local_58);
    local_48 = ZEXT416((uint)fVar1);
    auVar21 = vpermt2ps_avx512vl(local_58,_DAT_009d86b0,local_48);
    local_78._0_8_ = local_58._0_8_ ^ 0x8000000080000000;
    local_78._8_4_ = local_58._8_4_ ^ 0x80000000;
    local_78._12_4_ = local_58._12_4_ ^ 0x80000000;
    auVar36 = ZEXT1664(local_78);
    local_68._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
    local_68._8_4_ = auVar21._8_4_ ^ 0x80000000;
    local_68._12_4_ = auVar21._12_4_ ^ 0x80000000;
    auVar35 = ZEXT1664(local_68);
    do {
      local_98.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_98.m_floats[lVar20] = 1.0;
      cVar15.m_floats = local_98.m_floats;
      auVar29._8_8_ = 0;
      auVar29._0_4_ = local_98.m_floats[1];
      auVar29._4_4_ = local_98.m_floats[2];
      auVar31._0_4_ = cVar15.m_floats[1] * auVar35._0_4_;
      auVar31._4_4_ = cVar15.m_floats[2] * auVar35._4_4_;
      auVar31._8_4_ = auVar35._8_4_ * 0.0;
      auVar31._12_4_ = auVar35._12_4_ * 0.0;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * local_98.m_floats[0])),auVar32._0_16_
                                ,auVar29);
      auVar21 = vpermt2ps_avx512vl(auVar29,auVar34._0_16_,ZEXT416((uint)local_98.m_floats[0]));
      auVar27 = vfmadd213ps_fma(auVar21,auVar33._0_16_,auVar31);
      local_88.m_floats = (cbtScalar  [4])vinsertps_avx(auVar27,auVar23,0x28);
      auVar24._0_4_ = auVar27._0_4_ * auVar27._0_4_;
      auVar24._4_4_ = auVar27._4_4_ * auVar27._4_4_;
      auVar24._8_4_ = auVar27._8_4_ * auVar27._8_4_;
      auVar24._12_4_ = auVar27._12_4_ * auVar27._12_4_;
      auVar21 = vmovshdup_avx(auVar24);
      auVar21 = vfmadd231ss_fma(auVar21,auVar27,auVar27);
      auVar21 = vfmadd231ss_fma(auVar21,auVar23,auVar23);
      if (0.0 < auVar21._0_4_) {
        psVar4 = this->m_simplex;
        uVar18 = psVar4->rank;
        psVar4->p[uVar18] = 0.0;
        uVar19 = this->m_nfree - 1;
        this->m_nfree = uVar19;
        psVar5 = this->m_free[uVar19];
        psVar4->c[uVar18] = psVar5;
        psVar4->rank = uVar18 + 1;
        local_98.m_floats = cVar15.m_floats;
        getsupport(this,&local_88,psVar5);
        bVar16 = EncloseOrigin(this);
        if (bVar16) {
          return true;
        }
        psVar4 = this->m_simplex;
        uVar18 = psVar4->rank - 1;
        psVar4->rank = uVar18;
        psVar5 = psVar4->c[uVar18];
        uVar18 = this->m_nfree;
        this->m_free[uVar18] = psVar5;
        psVar4 = this->m_simplex;
        auVar25._0_8_ = local_88.m_floats._0_8_ ^ 0x8000000080000000;
        auVar25._8_4_ = 0x80000000;
        auVar25._12_4_ = 0x80000000;
        auVar30._0_4_ = -local_88.m_floats[2];
        auVar30._4_4_ = 0x80000000;
        auVar30._8_4_ = 0x80000000;
        auVar30._12_4_ = 0x80000000;
        local_30.m_floats = (cbtScalar  [4])vinsertps_avx(auVar25,auVar30,0x28);
        uVar19 = psVar4->rank;
        psVar4->p[uVar19] = 0.0;
        this->m_nfree = uVar18;
        psVar4->c[uVar19] = psVar5;
        psVar4->rank = uVar19 + 1;
        getsupport(this,&local_30,psVar5);
        bVar16 = EncloseOrigin(this);
        if (bVar16) {
          return true;
        }
        psVar4 = this->m_simplex;
        auVar32 = ZEXT1664(local_48);
        auVar33 = ZEXT1664(local_58);
        auVar34 = ZEXT1664(_DAT_009d86b0);
        auVar35 = ZEXT1664(local_68);
        auVar36 = ZEXT1664(local_78);
        uVar18 = psVar4->rank - 1;
        psVar4->rank = uVar18;
        psVar5 = psVar4->c[uVar18];
        uVar18 = this->m_nfree;
        this->m_nfree = uVar18 + 1;
        this->m_free[uVar18] = psVar5;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    break;
  case 3:
    psVar5 = psVar4->c[1];
    psVar6 = psVar4->c[0];
    psVar7 = psVar4->c[2];
    fVar1 = (psVar6->w).m_floats[0];
    fVar2 = (psVar6->w).m_floats[1];
    fVar3 = (psVar6->w).m_floats[2];
    fVar9 = (psVar5->w).m_floats[0] - fVar1;
    fVar10 = (psVar5->w).m_floats[1] - fVar2;
    fVar11 = (psVar5->w).m_floats[2] - fVar3;
    fVar1 = (psVar7->w).m_floats[0] - fVar1;
    fVar2 = (psVar7->w).m_floats[1] - fVar2;
    fVar3 = (psVar7->w).m_floats[2] - fVar3;
    auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar11)),ZEXT416((uint)fVar10),
                              ZEXT416((uint)fVar3));
    auVar23 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar9)),ZEXT416((uint)fVar1),
                              ZEXT416((uint)fVar11));
    auVar28 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar10)),ZEXT416((uint)fVar9),
                              ZEXT416((uint)fVar2));
    auVar21 = vinsertps_avx(auVar27,auVar23,0x10);
    local_98.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,auVar28,0x28);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * auVar23._0_4_)),auVar27,auVar27);
    auVar21 = vfmadd231ss_fma(auVar21,auVar28,auVar28);
    if (0.0 < auVar21._0_4_) {
      psVar4->p[3] = 0.0;
      uVar18 = this->m_nfree - 1;
      this->m_nfree = uVar18;
      psVar5 = this->m_free[uVar18];
      psVar4->c[3] = psVar5;
      psVar4->rank = 4;
      getsupport(this,&local_98,psVar5);
      bVar16 = EncloseOrigin(this);
      if (!bVar16) {
        psVar4 = this->m_simplex;
        uVar18 = psVar4->rank - 1;
        psVar4->rank = uVar18;
        psVar5 = psVar4->c[uVar18];
        uVar18 = this->m_nfree;
        this->m_free[uVar18] = psVar5;
        psVar4 = this->m_simplex;
        auVar21._0_8_ = local_98.m_floats._0_8_ ^ 0x8000000080000000;
        auVar21._8_4_ = 0x80000000;
        auVar21._12_4_ = 0x80000000;
        auVar27._0_4_ = -local_98.m_floats[2];
        auVar27._4_4_ = 0x80000000;
        auVar27._8_4_ = 0x80000000;
        auVar27._12_4_ = 0x80000000;
        local_88.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,auVar27,0x28);
        uVar19 = psVar4->rank;
        psVar4->p[uVar19] = 0.0;
        this->m_nfree = uVar18;
        psVar4->c[uVar19] = psVar5;
        psVar4->rank = uVar19 + 1;
        getsupport(this,&local_88,psVar5);
        bVar16 = EncloseOrigin(this);
        if (!bVar16) {
          psVar4 = this->m_simplex;
          uVar18 = psVar4->rank - 1;
          psVar4->rank = uVar18;
          psVar5 = psVar4->c[uVar18];
          uVar18 = this->m_nfree;
          this->m_nfree = uVar18 + 1;
          this->m_free[uVar18] = psVar5;
          return false;
        }
      }
      return true;
    }
    break;
  case 4:
    psVar5 = psVar4->c[3];
    psVar6 = psVar4->c[0];
    psVar7 = psVar4->c[1];
    psVar8 = psVar4->c[2];
    fVar1 = (psVar5->w).m_floats[1];
    fVar2 = (psVar5->w).m_floats[0];
    fVar3 = (psVar5->w).m_floats[2];
    fVar9 = (psVar6->w).m_floats[1] - fVar1;
    fVar10 = (psVar7->w).m_floats[1] - fVar1;
    fVar1 = (psVar8->w).m_floats[1] - fVar1;
    fVar11 = (psVar6->w).m_floats[2] - fVar3;
    fVar12 = (psVar7->w).m_floats[0] - fVar2;
    fVar13 = (psVar7->w).m_floats[2] - fVar3;
    fVar14 = (psVar6->w).m_floats[0] - fVar2;
    auVar27 = ZEXT416((uint)((psVar8->w).m_floats[0] - fVar2));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar12 * fVar1)),auVar27,
                              ZEXT416((uint)(fVar13 * fVar9)));
    auVar21 = vfnmadd213ss_fma(ZEXT416((uint)(fVar13 * fVar14)),ZEXT416((uint)fVar1),auVar21);
    auVar23 = ZEXT416((uint)((psVar8->w).m_floats[2] - fVar3));
    auVar21 = vfnmadd213ss_fma(ZEXT416((uint)(fVar12 * fVar9)),auVar23,auVar21);
    auVar21 = vfmadd213ss_fma(ZEXT416((uint)(fVar14 * fVar10)),auVar23,auVar21);
    auVar21 = vfnmadd213ss_fma(ZEXT416((uint)(fVar10 * fVar11)),auVar27,auVar21);
    if (auVar21._0_4_ != 0.0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EncloseOrigin()
	{
		switch (m_simplex->rank)
		{
			case 1:
			{
				for (U i = 0; i < 3; ++i)
				{
					cbtVector3 axis = cbtVector3(0, 0, 0);
					axis[i] = 1;
					appendvertice(*m_simplex, axis);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
					appendvertice(*m_simplex, -axis);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
				}
			}
			break;
			case 2:
			{
				const cbtVector3 d = m_simplex->c[1]->w - m_simplex->c[0]->w;
				for (U i = 0; i < 3; ++i)
				{
					cbtVector3 axis = cbtVector3(0, 0, 0);
					axis[i] = 1;
					const cbtVector3 p = cbtCross(d, axis);
					if (p.length2() > 0)
					{
						appendvertice(*m_simplex, p);
						if (EncloseOrigin()) return (true);
						removevertice(*m_simplex);
						appendvertice(*m_simplex, -p);
						if (EncloseOrigin()) return (true);
						removevertice(*m_simplex);
					}
				}
			}
			break;
			case 3:
			{
				const cbtVector3 n = cbtCross(m_simplex->c[1]->w - m_simplex->c[0]->w,
											m_simplex->c[2]->w - m_simplex->c[0]->w);
				if (n.length2() > 0)
				{
					appendvertice(*m_simplex, n);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
					appendvertice(*m_simplex, -n);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
				}
			}
			break;
			case 4:
			{
				if (cbtFabs(det(m_simplex->c[0]->w - m_simplex->c[3]->w,
							   m_simplex->c[1]->w - m_simplex->c[3]->w,
							   m_simplex->c[2]->w - m_simplex->c[3]->w)) > 0)
					return (true);
			}
			break;
		}
		return (false);
	}